

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexTriangleMeshShape.cpp
# Opt level: O2

void __thiscall
LocalSupportVertexCallback::internalProcessTriangleIndex
          (LocalSupportVertexCallback *this,btVector3 *triangle,int partId,int triangleIndex)

{
  btVector3 *v;
  undefined8 uVar1;
  long lVar2;
  btScalar bVar3;
  
  for (lVar2 = 0; lVar2 != 0x30; lVar2 = lVar2 + 0x10) {
    v = (btVector3 *)((long)triangle->m_floats + lVar2);
    bVar3 = btVector3::dot(&this->m_supportVecLocal,v);
    if (this->m_maxDot <= bVar3 && bVar3 != this->m_maxDot) {
      this->m_maxDot = bVar3;
      uVar1 = *(undefined8 *)(v->m_floats + 2);
      *(undefined8 *)(this->m_supportVertexLocal).m_floats = *(undefined8 *)v->m_floats;
      *(undefined8 *)((this->m_supportVertexLocal).m_floats + 2) = uVar1;
    }
  }
  return;
}

Assistant:

virtual void internalProcessTriangleIndex(btVector3* triangle,int partId,int  triangleIndex)
	{
		(void)triangleIndex;
		(void)partId;

		for (int i=0;i<3;i++)
		{
			btScalar dot = m_supportVecLocal.dot(triangle[i]);
			if (dot > m_maxDot)
			{
				m_maxDot = dot;
				m_supportVertexLocal = triangle[i];
			}
		}
	}